

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O0

void __thiscall
ft::multiset<int,_ft::greater<int>,_ft::allocator<int>_>::clear
          (multiset<int,_ft::greater<int>,_ft::allocator<int>_> *this)

{
  iterator local_40;
  iterator local_28;
  multiset<int,_ft::greater<int>,_ft::allocator<int>_> *local_10;
  multiset<int,_ft::greater<int>,_ft::allocator<int>_> *this_local;
  
  local_10 = this;
  treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>::begin
            (&local_28,(treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *)this);
  treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>::end
            (&local_40,(treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *)this);
  erase(this,&local_28,&local_40);
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~treeIterator(&local_40);
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~treeIterator(&local_28);
  return;
}

Assistant:

void clear() {
		this->erase(this->begin(), this->end());
	}